

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_add_stat(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  REF_STATUS RVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  RVar1 = 3;
  if (0.0 < observation) {
    dVar3 = log2(observation);
    if (ref_histogram->nstat < 1) {
      RVar1 = 0;
    }
    else {
      RVar1 = 0;
      lVar2 = 0;
      do {
        dVar4 = pow(dVar3 - ref_histogram->log_mean,(double)(int)lVar2);
        ref_histogram->stats[lVar2] = dVar4 + ref_histogram->stats[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 < ref_histogram->nstat);
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_stat(REF_HISTOGRAM ref_histogram,
                                          REF_DBL observation) {
  REF_INT i;
  REF_DBL log_obs;

  if (observation <= 0.0) return REF_INVALID;

  log_obs = log2(observation);

  for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
    ref_histogram_stat(ref_histogram, i) +=
        pow(log_obs - ref_histogram_log_mean(ref_histogram), i);

  return REF_SUCCESS;
}